

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall extract_file::~extract_file(extract_file *this)

{
  (this->super_action)._vptr_action = (_func_int **)&PTR__extract_file_001438e0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_filter).super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->_dstpath);
  std::__cxx11::string::~string((string *)&this->_romname);
  std::__cxx11::string::~string((string *)&this->_fsname);
  return;
}

Assistant:

virtual ~extract_file() { }